

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O2

int __thiscall
FIX::DataDictionary::addXMLComponentFields
          (DataDictionary *this,DOMDocument *pDoc,DOMNode *pNode,string *msgtype,DataDictionary *DD,
          bool componentRequired)

{
  DOMNode *pDVar1;
  _Alloc_hider _Var2;
  long *plVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  int field;
  ConfigError *pCVar7;
  pointer *__ptr;
  string *pDoc_00;
  undefined7 in_register_00000089;
  DOMNode *local_f8;
  string name_1;
  int local_d0;
  allocator<char> local_c9;
  long *local_c8;
  string required;
  long *local_88;
  undefined4 local_7c;
  long *local_78;
  long *local_70 [4];
  string name;
  
  local_7c = (undefined4)CONCAT71(in_register_00000089,componentRequired);
  (*pNode->_vptr_DOMNode[4])(&local_78,pNode);
  plVar3 = local_78;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name_1,"name",(allocator<char> *)&required);
  cVar4 = (**(code **)(*plVar3 + 0x10))(plVar3,&name_1,&name);
  std::__cxx11::string::~string((string *)&name_1);
  if (cVar4 == '\0') {
    pCVar7 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name_1,"No name given to component",(allocator<char> *)&required);
    ConfigError::ConfigError(pCVar7,&name_1);
    __cxa_throw(pCVar7,&ConfigError::typeinfo,Exception::~Exception);
  }
  std::operator+(&required,"/fix/components/component[@name=\'",&name);
  std::operator+(&name_1,&required,"\']");
  (*pDoc->_vptr_DOMDocument[5])(&local_88,pDoc,&name_1);
  std::__cxx11::string::~string((string *)&name_1);
  std::__cxx11::string::~string((string *)&required);
  if (local_88 == (long *)0x0) {
    pCVar7 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::operator+(&name_1,"Component not found: ",&name);
    ConfigError::ConfigError(pCVar7,&name_1);
    __cxa_throw(pCVar7,&ConfigError::typeinfo,Exception::~Exception);
  }
  (**(code **)(*local_88 + 0x10))(&local_f8);
  local_d0 = 0;
  do {
    if (local_f8 == (DOMNode *)0x0) {
      if (local_88 != (long *)0x0) {
        (**(code **)(*local_88 + 8))();
      }
      std::__cxx11::string::~string((string *)&name);
      if (local_78 != (long *)0x0) {
        (**(code **)(*local_78 + 8))();
      }
      return local_d0;
    }
    (*local_f8->_vptr_DOMNode[5])(&name_1);
    bVar5 = std::operator==(&name_1,"field");
    if (bVar5) {
      std::__cxx11::string::~string((string *)&name_1);
LAB_001733dc:
      (*local_f8->_vptr_DOMNode[4])(&local_c8);
      plVar3 = local_c8;
      name_1._M_dataplus._M_p = (pointer)&name_1.field_2;
      name_1._M_string_length = 0;
      name_1.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&required,"name",(allocator<char> *)local_70);
      pDoc_00 = &required;
      cVar4 = (**(code **)(*plVar3 + 0x10))(plVar3,&required,&name_1);
      std::__cxx11::string::~string((string *)&required);
      if (cVar4 == '\0') {
        pCVar7 = (ConfigError *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&required,"No name given to field",(allocator<char> *)local_70);
        ConfigError::ConfigError(pCVar7,&required);
        __cxa_throw(pCVar7,&ConfigError::typeinfo,Exception::~Exception);
      }
      field = lookupXMLFieldNumber(this,(DOMDocument *)pDoc_00,&name_1);
      plVar3 = local_c8;
      if (local_d0 == 0) {
        local_d0 = field;
      }
      required._M_dataplus._M_p = (pointer)&required.field_2;
      required._M_string_length = 0;
      required.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"required",&local_c9);
      cVar4 = (**(code **)(*plVar3 + 0x10))(plVar3,(string *)local_70,&required);
      if ((cVar4 == '\0') ||
         ((bVar5 = std::operator==(&required,"Y"), !bVar5 &&
          (bVar5 = std::operator==(&required,"y"), !bVar5)))) {
        std::__cxx11::string::~string((string *)local_70);
      }
      else {
        std::__cxx11::string::~string((string *)local_70);
        if ((char)local_7c != '\0') {
          addRequiredField(this,msgtype,field);
        }
      }
      addField(DD,field);
      addMsgField(DD,msgtype,field);
      std::__cxx11::string::~string((string *)&required);
      std::__cxx11::string::~string((string *)&name_1);
      if (local_c8 != (long *)0x0) {
        (**(code **)(*local_c8 + 8))();
      }
    }
    else {
      (*local_f8->_vptr_DOMNode[5])(&required);
      bVar5 = std::operator==(&required,"group");
      std::__cxx11::string::~string((string *)&required);
      std::__cxx11::string::~string((string *)&name_1);
      if (bVar5) goto LAB_001733dc;
    }
    (*local_f8->_vptr_DOMNode[5])(&name_1);
    bVar5 = std::operator==(&name_1,"component");
    std::__cxx11::string::~string((string *)&name_1);
    if (bVar5) {
      (*local_f8->_vptr_DOMNode[4])((string *)local_70);
      plVar3 = local_70[0];
      name_1._M_dataplus._M_p = (pointer)&name_1.field_2;
      name_1._M_string_length = 0;
      name_1.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&required,"required",(allocator<char> *)&local_c8);
      (**(code **)(*plVar3 + 0x10))(plVar3,&required,&name_1);
      std::__cxx11::string::~string((string *)&required);
      bVar5 = std::operator==(&name_1,"Y");
      bVar6 = true;
      if (!bVar5) {
        bVar6 = std::operator==(&name_1,"y");
      }
      addXMLComponentFields(this,pDoc,local_f8,msgtype,DD,bVar6);
      std::__cxx11::string::~string((string *)&name_1);
      if (local_70[0] != (long *)0x0) {
        (**(code **)(*local_70[0] + 8))();
      }
    }
    (*local_f8->_vptr_DOMNode[5])(&name_1);
    bVar5 = std::operator==(&name_1,"group");
    std::__cxx11::string::~string((string *)&name_1);
    if (bVar5) {
      (*local_f8->_vptr_DOMNode[4])((string *)local_70);
      plVar3 = local_70[0];
      name_1._M_dataplus._M_p = (pointer)&name_1.field_2;
      name_1._M_string_length = 0;
      name_1.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&required,"required",(allocator<char> *)&local_c8);
      (**(code **)(*plVar3 + 0x10))(plVar3,&required,&name_1);
      std::__cxx11::string::~string((string *)&required);
      bVar5 = std::operator==(&name_1,"Y");
      bVar6 = true;
      if (!bVar5) {
        bVar6 = std::operator==(&name_1,"y");
      }
      addXMLGroup(this,pDoc,local_f8,msgtype,DD,bVar6);
      std::__cxx11::string::~string((string *)&name_1);
      if (local_70[0] != (long *)0x0) {
        (**(code **)(*local_70[0] + 8))();
      }
    }
    (*local_f8->_vptr_DOMNode[3])(&name_1);
    _Var2 = name_1._M_dataplus;
    pDVar1 = local_f8;
    local_f8 = (DOMNode *)name_1._M_dataplus._M_p;
    name_1._M_dataplus._M_p = (pointer)0x0;
    if ((pDVar1 != (DOMNode *)0x0) &&
       ((*pDVar1->_vptr_DOMNode[1])(), name_1._M_dataplus._M_p != (pointer)0x0)) {
      (**(code **)(*(long *)name_1._M_dataplus._M_p + 8))();
    }
  } while( true );
}

Assistant:

int DataDictionary::addXMLComponentFields(
    DOMDocument *pDoc,
    DOMNode *pNode,
    const std::string &msgtype,
    DataDictionary &DD,
    bool componentRequired) {
  int firstField = 0;

  DOMAttributesPtr attrs = pNode->getAttributes();
  std::string name;
  if (!attrs->get("name", name)) {
    throw ConfigError("No name given to component");
  }

  DOMNodePtr pComponentNode = pDoc->getNode("/fix/components/component[@name='" + name + "']");
  if (pComponentNode.get() == 0) {
    throw ConfigError("Component not found: " + name);
  }

  DOMNodePtr pComponentFieldNode = pComponentNode->getFirstChildNode();
  while (pComponentFieldNode.get()) {
    if (pComponentFieldNode->getName() == "field" || pComponentFieldNode->getName() == "group") {
      DOMAttributesPtr attrs = pComponentFieldNode->getAttributes();
      std::string name;
      if (!attrs->get("name", name)) {
        throw ConfigError("No name given to field");
      }
      int field = lookupXMLFieldNumber(pDoc, name);
      if (firstField == 0) {
        firstField = field;
      }

      std::string required;
      if (attrs->get("required", required) && (required == "Y" || required == "y") && componentRequired) {
        addRequiredField(msgtype, field);
      }

      DD.addField(field);
      DD.addMsgField(msgtype, field);
    }
    if (pComponentFieldNode->getName() == "component") {
      DOMAttributesPtr attrs = pComponentFieldNode->getAttributes();
      std::string required;
      attrs->get("required", required);
      bool isRequired = (required == "Y" || required == "y");
      addXMLComponentFields(pDoc, pComponentFieldNode.get(), msgtype, DD, isRequired);
    }
    if (pComponentFieldNode->getName() == "group") {
      DOMAttributesPtr attrs = pComponentFieldNode->getAttributes();
      std::string required;
      attrs->get("required", required);
      bool isRequired = (required == "Y" || required == "y");
      addXMLGroup(pDoc, pComponentFieldNode.get(), msgtype, DD, isRequired);
    }
    RESET_AUTO_PTR(pComponentFieldNode, pComponentFieldNode->getNextSiblingNode());
  }
  return firstField;
}